

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_lookup.cpp
# Opt level: O0

bool __thiscall
ON_SerialNumberMap::IsValid(ON_SerialNumberMap *this,bool bBuildHashTable,ON_TextLog *textlog)

{
  SN_ELEMENT **ppSVar1;
  bool bVar2;
  ON__UINT32 OVar3;
  bool bVar4;
  ON__UINT32 local_cc;
  SN_ELEMENT ***local_c0;
  ON__UINT32 local_a4;
  SN_ELEMENT ***local_98;
  SN_ELEMENT *local_68;
  SN_ELEMENT *e;
  ON__UINT32 hash_i;
  SN_ELEMENT **hash_table_block;
  ON__UINT32 hash_block_index;
  bool bTestHashTable;
  ON__UINT64 aic;
  ON__UINT64 pc;
  ON__UINT64 c;
  ON__UINT64 i;
  ON_TextLog *textlog_local;
  ON_SerialNumberMap *pOStack_18;
  bool bBuildHashTable_local;
  ON_SerialNumberMap *this_local;
  
  _hash_block_index = 0;
  bVar4 = false;
  if ((this->m_active_id_count != 0) && (bVar4 = true, !bBuildHashTable)) {
    bVar4 = this->m_bHashTableIsValid != '\0';
  }
  i = (ON__UINT64)textlog;
  textlog_local._7_1_ = bBuildHashTable;
  pOStack_18 = this;
  if (((bVar4) && (this->m_bHashTableIsValid == '\0')) &&
     ((Internal_HashTableBuild(this), this->m_bHashTableIsValid == '\0' ||
      ((this->m_hash_table_blocks == (SN_ELEMENT ***)0x0 || (this->m_hash_block_count == 0)))))) {
    if (i != 0) {
      ON_TextLog::Print((ON_TextLog *)i,"Unable to build hash table.\n");
    }
    this_local._7_1_ = ON_SerialNumberMap_IsNotValid();
  }
  else {
    if (bVar4) {
      local_98 = this->m_hash_table_blocks;
      local_a4 = this->m_hash_block_count;
    }
    else {
      local_98 = (SN_ELEMENT ***)0x0;
      local_a4 = 0;
    }
    bVar2 = ON_SN_BLOCK::IsValidBlock
                      (this->m_sn_block0,(ON_TextLog *)i,local_98,local_a4,
                       (ON__UINT64 *)&hash_block_index);
    if (bVar2) {
      pc = (ON__UINT64)this->m_sn_block0->m_count;
      aic = (ON__UINT64)this->m_sn_block0->m_purged;
      for (c = 0; c < this->m_snblk_list_count; c = c + 1) {
        if (this->m_snblk_list[c]->m_count == 0) {
          if (i != 0) {
            ON_TextLog::Print((ON_TextLog *)i,"m_snblk_list[%d] is empty\n",c);
          }
          bVar4 = ON_SerialNumberMap_IsNotValid();
          return bVar4;
        }
        if (this->m_snblk_list[c]->m_sorted != 1) {
          if (i != 0) {
            ON_TextLog::Print((ON_TextLog *)i,"m_snblk_list[%d] is not sorted\n",c);
          }
          bVar4 = ON_SerialNumberMap_IsNotValid();
          return bVar4;
        }
        if (bVar4) {
          local_c0 = this->m_hash_table_blocks;
          local_cc = this->m_hash_block_count;
        }
        else {
          local_c0 = (SN_ELEMENT ***)0x0;
          local_cc = 0;
        }
        bVar2 = ON_SN_BLOCK::IsValidBlock
                          (this->m_snblk_list[c],(ON_TextLog *)i,local_c0,local_cc,
                           (ON__UINT64 *)&hash_block_index);
        if (!bVar2) {
          if (i != 0) {
            ON_TextLog::Print((ON_TextLog *)i,"m_snblk_list[%d] is not valid\n",c);
          }
          bVar4 = ON_SerialNumberMap_IsNotValid();
          return bVar4;
        }
        pc = this->m_snblk_list[c]->m_count + pc;
        aic = this->m_snblk_list[c]->m_purged + aic;
        if ((c != 0) && (this->m_snblk_list[c]->m_sn0 <= this->m_snblk_list[c - 1]->m_sn1)) {
          if (i != 0) {
            ON_TextLog::Print((ON_TextLog *)i,"m_snblk_list[%d]->m_sn0 <= m_snblk_list[%d]->m_sn1\n"
                              ,c,c - 1);
          }
          bVar4 = ON_SerialNumberMap_IsNotValid();
          return bVar4;
        }
      }
      if (pc == this->m_sn_count) {
        if (aic == this->m_sn_purged) {
          if (this->m_active_id_count == _hash_block_index) {
            if (this->m_sn_count < this->m_active_id_count + this->m_sn_purged) {
              if (i != 0) {
                ON_TextLog::Print((ON_TextLog *)i,
                                  "m_active_id_count=%d > %d = (m_sn_count-m_sn_purged)\n",
                                  this->m_active_id_count,this->m_sn_count - this->m_sn_purged);
              }
              this_local._7_1_ = ON_SerialNumberMap_IsNotValid();
            }
            else {
              if (bVar4) {
                pc = 0;
                for (hash_table_block._0_4_ = 0; (uint)hash_table_block < this->m_hash_block_count;
                    hash_table_block._0_4_ = (uint)hash_table_block + 1) {
                  ppSVar1 = this->m_hash_table_blocks[(uint)hash_table_block];
                  for (e._4_4_ = 0; e._4_4_ < 0xffa; e._4_4_ = e._4_4_ + 1) {
                    local_68 = ppSVar1[e._4_4_];
                    while( true ) {
                      bVar4 = false;
                      if (local_68 != (SN_ELEMENT *)0x0) {
                        bVar4 = pc <= this->m_active_id_count;
                      }
                      if (!bVar4) break;
                      OVar3 = Internal_HashTableBlockIndex(this,local_68->m_id_crc32);
                      if (((uint)hash_table_block != OVar3) ||
                         (OVar3 = Internal_HashTableBlockRowIndex(local_68->m_id_crc32),
                         e._4_4_ != OVar3)) {
                        if (i != 0) {
                          ON_TextLog::Print((ON_TextLog *)i,
                                            "m_hash_table linked lists are corrupt.\n");
                        }
                        bVar4 = ON_SerialNumberMap_IsNotValid();
                        return bVar4;
                      }
                      pc = pc + 1;
                      local_68 = local_68->m_next;
                    }
                  }
                }
                if (this->m_active_id_count < pc) {
                  if (i != 0) {
                    ON_TextLog::Print((ON_TextLog *)i,
                                      "m_hash_table[] linked lists have too many elements.\n");
                  }
                  bVar4 = ON_SerialNumberMap_IsNotValid();
                  return bVar4;
                }
              }
              this_local._7_1_ = true;
            }
          }
          else {
            if (i != 0) {
              ON_TextLog::Print((ON_TextLog *)i,
                                "m_active_id_count=%d (should be %d) is not correct\n",
                                this->m_active_id_count,_hash_block_index);
            }
            this_local._7_1_ = ON_SerialNumberMap_IsNotValid();
          }
        }
        else {
          if (i != 0) {
            ON_TextLog::Print((ON_TextLog *)i,"m_sn_purged=%d (should be %d) is not correct\n",
                              this->m_sn_purged,aic);
          }
          this_local._7_1_ = ON_SerialNumberMap_IsNotValid();
        }
      }
      else {
        if (i != 0) {
          ON_TextLog::Print((ON_TextLog *)i,"m_sn_count=%d (should be %d) is not correct\n",
                            this->m_sn_count,pc);
        }
        this_local._7_1_ = ON_SerialNumberMap_IsNotValid();
      }
    }
    else {
      if (i != 0) {
        ON_TextLog::Print((ON_TextLog *)i,"m_sn_block0 is not valid\n");
      }
      this_local._7_1_ = ON_SerialNumberMap_IsNotValid();
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_SerialNumberMap::IsValid(
   bool bBuildHashTable,
   ON_TextLog* textlog
   ) const
{
  ON__UINT64 i, c, pc, aic;

  aic = 0;

  const bool bTestHashTable = (m_active_id_count > 0 && (bBuildHashTable || m_bHashTableIsValid));
  if (bTestHashTable && false == m_bHashTableIsValid)
  {
    const_cast<ON_SerialNumberMap*>(this)->Internal_HashTableBuild();
    if (false == m_bHashTableIsValid || nullptr == m_hash_table_blocks || m_hash_block_count <= 0)
    {
      if ( textlog )
        textlog->Print("Unable to build hash table.\n");
      return ON_SerialNumberMap_IsNotValid();
    }
  }

  if ( !m_sn_block0.IsValidBlock(
    textlog,
    bTestHashTable ? m_hash_table_blocks : nullptr,
    bTestHashTable ? m_hash_block_count : 0,
    &aic) 
    )
  {
    if ( textlog )
      textlog->Print("m_sn_block0 is not valid\n");
    return ON_SerialNumberMap_IsNotValid();
  }

  c = m_sn_block0.m_count;
  pc = m_sn_block0.m_purged;

  for ( i = 0; i < m_snblk_list_count; i++ )
  {
    if ( 0 == m_snblk_list[i]->m_count )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d] is empty\n",i);
      return ON_SerialNumberMap_IsNotValid();
    }
    if ( 1 != m_snblk_list[i]->m_sorted )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d] is not sorted\n",i);
      return ON_SerialNumberMap_IsNotValid();
    }
    if ( !m_snblk_list[i]->IsValidBlock(
      textlog,
      bTestHashTable ? m_hash_table_blocks : nullptr,
      bTestHashTable ? m_hash_block_count : 0,
      &aic) 
      )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d] is not valid\n",i);
      return ON_SerialNumberMap_IsNotValid();
    }
    c += m_snblk_list[i]->m_count;
    pc += m_snblk_list[i]->m_purged;
    if ( i>0 && m_snblk_list[i]->m_sn0 <= m_snblk_list[i-1]->m_sn1 )
    {
      if ( textlog )
        textlog->Print("m_snblk_list[%d]->m_sn0 <= m_snblk_list[%d]->m_sn1\n",i,i-1);
      return ON_SerialNumberMap_IsNotValid();
    }
  }

  if ( c != m_sn_count )
  {
    if ( textlog )
      textlog->Print("m_sn_count=%d (should be %d) is not correct\n",m_sn_count,c);
    return ON_SerialNumberMap_IsNotValid();
  }

  if ( pc != m_sn_purged )
  {
    if ( textlog )
      textlog->Print("m_sn_purged=%d (should be %d) is not correct\n",m_sn_purged,pc);
    return ON_SerialNumberMap_IsNotValid();
  }

  if ( m_active_id_count != aic )
  {
    if ( textlog )
      textlog->Print("m_active_id_count=%d (should be %d) is not correct\n",m_active_id_count,aic);
    return ON_SerialNumberMap_IsNotValid();
  }

  if ( m_active_id_count + m_sn_purged > m_sn_count )
  {
    if ( textlog )
      textlog->Print("m_active_id_count=%d > %d = (m_sn_count-m_sn_purged)\n",m_active_id_count,m_sn_count-m_sn_purged);
    return ON_SerialNumberMap_IsNotValid();
  }

  if (bTestHashTable)
  {
    c = 0;
    for (ON__UINT32 hash_block_index = 0; hash_block_index < m_hash_block_count; hash_block_index++)
    {
      const SN_ELEMENT*const* hash_table_block = m_hash_table_blocks[hash_block_index];
      for (ON__UINT32 hash_i = 0; hash_i < ON_SN_BLOCK::ID_HASH_BLOCK_CAPACITY; hash_i++)
      {
        for (const SN_ELEMENT* e = hash_table_block[hash_i]; nullptr != e && c <= m_active_id_count; e = e->m_next)
        {
          if (
            hash_block_index != Internal_HashTableBlockIndex(e->m_id_crc32)
            || hash_i != ON_SerialNumberMap::Internal_HashTableBlockRowIndex(e->m_id_crc32)
            )
          {
            if (textlog)
              textlog->Print("m_hash_table linked lists are corrupt.\n");
            return ON_SerialNumberMap_IsNotValid();
          }
          c++;
        }
      }
    }

    if (c > m_active_id_count)
    {
      if (textlog)
        textlog->Print("m_hash_table[] linked lists have too many elements.\n");
      return ON_SerialNumberMap_IsNotValid();
    }
  }

  return true;
}